

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

mpack_node_data_t * mpack_node_map_str_impl(mpack_node_t node,char *str,size_t length)

{
  mpack_node_data_t *pmVar1;
  bool bVar2;
  int iVar3;
  mpack_node_data_t *pmVar4;
  long lVar5;
  mpack_tree_t *pmVar6;
  mpack_node_data_t *pmVar7;
  ulong uVar8;
  
  pmVar6 = node.tree;
  pmVar7 = node.data;
  if (pmVar6->error != mpack_ok) {
    return (mpack_node_data_t *)0x0;
  }
  if (pmVar7->type == mpack_type_map) {
    if (pmVar7->len != 0) {
      lVar5 = 0x10;
      pmVar4 = (mpack_node_data_t *)0x0;
      uVar8 = 0;
      while( true ) {
        pmVar1 = (pmVar7->value).children;
        bVar2 = true;
        if (((*(int *)((long)&pmVar1[-1].type + lVar5) == 7) &&
            (*(uint *)((long)pmVar1 + lVar5 + -0xc) == length)) &&
           (iVar3 = bcmp(str,pmVar6->data + *(long *)((long)pmVar1 + lVar5 + -8),length), iVar3 == 0
           )) {
          if (pmVar4 == (mpack_node_data_t *)0x0) {
            pmVar4 = (mpack_node_data_t *)((long)&pmVar1->type + lVar5);
          }
          else {
            pmVar6->error = mpack_error_data;
            if (pmVar6->error_fn != (mpack_tree_error_t)0x0) {
              (*pmVar6->error_fn)(pmVar6,mpack_error_data);
            }
            bVar2 = false;
          }
        }
        if (!bVar2) break;
        uVar8 = uVar8 + 1;
        lVar5 = lVar5 + 0x20;
        if (pmVar7->len <= uVar8) {
          return pmVar4;
        }
      }
    }
  }
  else {
    pmVar6->error = mpack_error_type;
    if (pmVar6->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar6->error_fn)(pmVar6,mpack_error_type);
    }
  }
  return (mpack_node_data_t *)0x0;
}

Assistant:

static mpack_node_data_t* mpack_node_map_str_impl(mpack_node_t node, const char* str, size_t length) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    mpack_assert(length == 0 || str != NULL, "str of length %i is NULL", (int)length);

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    mpack_tree_t* tree = node.tree;
    mpack_node_data_t* found = NULL;

    for (size_t i = 0; i < node.data->len; ++i) {
        mpack_node_data_t* key = mpack_node_child(node, i * 2);

        if (key->type == mpack_type_str && key->len == length &&
                mpack_memcmp(str, mpack_node_data_unchecked(mpack_node(tree, key)), length) == 0) {
            if (found) {
                mpack_node_flag_error(node, mpack_error_data);
                return NULL;
            }
            found = mpack_node_child(node, i * 2 + 1);
        }
    }

    if (found)
        return found;

    return NULL;
}